

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

Subscriber __thiscall miniros::NodeHandle::subscribe(NodeHandle *this,SubscribeOptions *ops)

{
  bool bVar1;
  CallbackQueue *pCVar2;
  shared_ptr<miniros::Subscriber::Impl> *__r;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  element_type *in_RDI;
  Subscriber SVar4;
  scoped_lock<std::mutex> lock;
  Subscriber *sub;
  SubscribeOptions *in_stack_00000100;
  TopicManager *in_stack_00000108;
  mutex_type *in_stack_ffffffffffffff58;
  scoped_lock<std::mutex> *in_stack_ffffffffffffff60;
  vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
  *this_00;
  SubscriptionCallbackHelperPtr *in_stack_ffffffffffffff98;
  NodeHandle *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  string *in_stack_ffffffffffffffb0;
  NodeHandle *in_stack_ffffffffffffffb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  
  local_18._M_allocated_capacity = (size_type)in_RDX;
  resolveName(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
              SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0));
  std::__cxx11::string::operator=
            ((string *)local_18._M_allocated_capacity,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (*(long *)(local_18._M_allocated_capacity + 0x78) == 0) {
    if (*(long *)(in_RSI + 0xa0) == 0) {
      pCVar2 = getGlobalCallbackQueue();
      *(CallbackQueue **)(local_18._M_allocated_capacity + 0x78) = pCVar2;
    }
    else {
      *(undefined8 *)(local_18._M_allocated_capacity + 0x78) = *(undefined8 *)(in_RSI + 0xa0);
    }
  }
  getTopicManager((NodeHandle *)&stack0xffffffffffffffb8);
  std::__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x478e68);
  bVar1 = TopicManager::subscribe(in_stack_00000108,in_stack_00000100);
  std::shared_ptr<miniros::TopicManager>::~shared_ptr((shared_ptr<miniros::TopicManager> *)0x478e88)
  ;
  if (bVar1) {
    Subscriber::Subscriber
              ((Subscriber *)in_stack_ffffffffffffffb0,
               (string *)
               (CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8) & 0xffffffff00ffffff),
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::scoped_lock<std::mutex>::scoped_lock(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __r = (shared_ptr<miniros::Subscriber::Impl> *)(*(long *)(in_RSI + 0xa8) + 0x30);
    this_00 = (vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
               *)&stack0xffffffffffffff90;
    std::weak_ptr<miniros::Subscriber::Impl>::weak_ptr<miniros::Subscriber::Impl,void>
              ((weak_ptr<miniros::Subscriber::Impl> *)this_00,__r);
    std::
    vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
    ::push_back(this_00,(value_type *)__r);
    std::weak_ptr<miniros::Subscriber::Impl>::~weak_ptr
              ((weak_ptr<miniros::Subscriber::Impl> *)0x478f16);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x478f20);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    Subscriber::Subscriber((Subscriber *)0x478f9e);
    _Var3._M_pi = extraout_RDX_00;
  }
  SVar4.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  SVar4.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (Subscriber)
         SVar4.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Subscriber NodeHandle::subscribe(SubscribeOptions& ops)
{
  ops.topic = resolveName(ops.topic);
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  if (getTopicManager()->subscribe(ops))
  {
    Subscriber sub(ops.topic, *this, ops.helper);

    {
      std::scoped_lock<std::mutex> lock(collection_->mutex_);
      collection_->subs_.push_back(sub.impl_);
    }

    return sub;
  }

  return Subscriber();
}